

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O2

void __thiscall
btSequentialImpulseConstraintSolver::resolveSplitPenetrationImpulseCacheFriendly
          (btSequentialImpulseConstraintSolver *this,btSolverBody *body1,btSolverBody *body2,
          btSolverConstraint *c)

{
  float fVar1;
  btScalar bVar2;
  btScalar bVar3;
  btScalar bVar4;
  btScalar bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  btVector3 local_40;
  
  fVar1 = c->m_rhsPenetration;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    gNumSplitImpulseRecoveries = gNumSplitImpulseRecoveries + 1;
    fVar7 = c->m_appliedPushImpulse;
    fVar6 = c->m_cfm;
    bVar2 = btVector3::dot(&c->m_contactNormal1,&body1->m_pushVelocity);
    bVar3 = btVector3::dot(&c->m_relpos1CrossNormal,&body1->m_turnVelocity);
    bVar4 = btVector3::dot(&c->m_contactNormal2,&body2->m_pushVelocity);
    bVar5 = btVector3::dot(&c->m_relpos2CrossNormal,&body2->m_turnVelocity);
    fVar6 = ((fVar1 - fVar7 * fVar6) - (bVar3 + bVar2) * c->m_jacDiagABInv) -
            (bVar5 + bVar4) * c->m_jacDiagABInv;
    fVar1 = c->m_lowerLimit;
    fVar8 = c->m_appliedPushImpulse + fVar6;
    fVar7 = fVar1;
    if (fVar1 <= fVar8) {
      fVar7 = fVar8;
    }
    bVar2 = (btScalar)
            (-(uint)(fVar8 < fVar1) & (uint)(fVar1 - c->m_appliedPushImpulse) |
            ~-(uint)(fVar8 < fVar1) & (uint)fVar6);
    c->m_appliedPushImpulse = fVar7;
    local_40 = operator*(&c->m_contactNormal1,&body1->m_invMass);
    btSolverBody::internalApplyPushImpulse(body1,&local_40,&c->m_angularComponentA,bVar2);
    local_40 = operator*(&c->m_contactNormal2,&body2->m_invMass);
    btSolverBody::internalApplyPushImpulse(body2,&local_40,&c->m_angularComponentB,bVar2);
  }
  return;
}

Assistant:

void	btSequentialImpulseConstraintSolver::resolveSplitPenetrationImpulseCacheFriendly(
        btSolverBody& body1,
        btSolverBody& body2,
        const btSolverConstraint& c)
{
		if (c.m_rhsPenetration)
        {
			gNumSplitImpulseRecoveries++;
			btScalar deltaImpulse = c.m_rhsPenetration-btScalar(c.m_appliedPushImpulse)*c.m_cfm;
			const btScalar deltaVel1Dotn	=	c.m_contactNormal1.dot(body1.internalGetPushVelocity()) 	+ c.m_relpos1CrossNormal.dot(body1.internalGetTurnVelocity());
			const btScalar deltaVel2Dotn	=	c.m_contactNormal2.dot(body2.internalGetPushVelocity())		+ c.m_relpos2CrossNormal.dot(body2.internalGetTurnVelocity());

			deltaImpulse	-=	deltaVel1Dotn*c.m_jacDiagABInv;
			deltaImpulse	-=	deltaVel2Dotn*c.m_jacDiagABInv;
			const btScalar sum = btScalar(c.m_appliedPushImpulse) + deltaImpulse;
			if (sum < c.m_lowerLimit)
			{
				deltaImpulse = c.m_lowerLimit-c.m_appliedPushImpulse;
				c.m_appliedPushImpulse = c.m_lowerLimit;
			}
			else
			{
				c.m_appliedPushImpulse = sum;
			}
			body1.internalApplyPushImpulse(c.m_contactNormal1*body1.internalGetInvMass(),c.m_angularComponentA,deltaImpulse);
			body2.internalApplyPushImpulse(c.m_contactNormal2*body2.internalGetInvMass(),c.m_angularComponentB,deltaImpulse);
        }
}